

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

GLFWbool waitForVisibilityNotify(_GLFWwindow *window)

{
  int iVar1;
  GLFWbool GVar2;
  double timeout;
  XEvent dummy;
  
  timeout = 0.1;
  do {
    iVar1 = (*_glfw.x11.xlib.CheckTypedWindowEvent)
                      (_glfw.x11.display,(window->x11).handle,0xf,&dummy);
    if (iVar1 != 0) {
      return iVar1;
    }
    GVar2 = waitForEvent(&timeout);
  } while (GVar2 != 0);
  return 0;
}

Assistant:

static GLFWbool waitForVisibilityNotify(_GLFWwindow* window)
{
    XEvent dummy;
    double timeout = 0.1;

    while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                   window->x11.handle,
                                   VisibilityNotify,
                                   &dummy))
    {
        if (!waitForEvent(&timeout))
            return GLFW_FALSE;
    }

    return GLFW_TRUE;
}